

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOWFileParser.cpp
# Opt level: O0

void __thiscall BOWFileParser::writeWordList(BOWFileParser *this,string *wordListFilename)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_228;
  int v;
  string local_218 [8];
  ofstream wordListFp;
  string *wordListFilename_local;
  BOWFileParser *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,(_Ios_Openmode)wordListFilename);
  local_228 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->_wordList);
    if (sVar1 <= (ulong)(long)local_228) break;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->_wordList,(long)local_228);
    std::operator<<((ostream *)local_218,(string *)pvVar2);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->_wordList);
    if ((long)local_228 != sVar1 - 1) {
      std::ostream::operator<<((ostream *)local_218,std::endl<char,std::char_traits<char>>);
    }
    local_228 = local_228 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void BOWFileParser::writeWordList(string wordListFilename)const{//{{{
    ofstream wordListFp;
    wordListFp.open(wordListFilename,ios::out);
    for(int v=0;v<_wordList.size();v++){
        wordListFp<<_wordList[v];
        if(v!=(_wordList.size()-1))wordListFp<<endl;
    }
    wordListFp.close();
}